

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::handle_custom_notification_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *this_00;
  resp_msg *in_RSI;
  long in_RDI;
  ptr<peer> p;
  peer_itor it;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffff58;
  shared_ptr<nuraft::peer> *idx;
  shared_ptr<nuraft::peer> *in_stack_ffffffffffffff60;
  shared_ptr<nuraft::peer> local_70 [2];
  string local_50 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_30;
  int32 local_24;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_20;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_18;
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = resp_msg::get_accepted(in_RSI);
  if (bVar1) {
    local_24 = msg_base::get_src(&local_10->super_msg_base);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x1cc620);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_ffffffffffffff60,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_ffffffffffffff58);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::__detail::operator==(&local_18,&local_30);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cc699);
        iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
        if (3 < iVar2) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cc6bc);
          uVar3 = msg_base::get_src(&local_10->super_msg_base);
          msg_if_given_abi_cxx11_
                    ((char *)local_50,"the response is from an unknown peer %d",(ulong)uVar3);
          (**(code **)(*(long *)peVar4 + 0x40))
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                     ,"handle_custom_notification_resp",0xfe,local_50);
          std::__cxx11::string::~string(local_50);
        }
      }
    }
    else {
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x1cc74e);
      idx = local_70;
      std::shared_ptr<nuraft::peer>::shared_ptr(in_stack_ffffffffffffff60,idx);
      this_00 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1cc76c);
      resp_msg::get_next_idx(local_10);
      peer::set_next_log_idx(this_00,(ulong)idx);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1cc7a0);
    }
  }
  return;
}

Assistant:

void raft_server::handle_custom_notification_resp(resp_msg& resp) {
    if (!resp.get_accepted()) return;

    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }
    ptr<peer> p = it->second;

    p->set_next_log_idx(resp.get_next_idx());
}